

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O2

string * __thiscall
cmNinjaTargetGenerator::GetTargetFilePath
          (string *__return_storage_ptr__,cmNinjaTargetGenerator *this,string *name,string *config)

{
  bool bVar1;
  string path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_98;
  cmAlphaNum local_78;
  cmAlphaNum local_48;
  
  (*(this->super_cmCommonTargetGenerator)._vptr_cmCommonTargetGenerator[4])(&local_b8,this,config);
  if (local_b8._M_string_length != 0) {
    bVar1 = std::operator==(&local_b8,".");
    if (!bVar1) {
      local_78.View_._M_str = local_78.Digits_;
      local_78.View_._M_len = 1;
      local_78.Digits_[0] = '/';
      local_48.View_._M_str = (name->_M_dataplus)._M_p;
      local_48.View_._M_len = name->_M_string_length;
      cmStrCat<>(&local_98,&local_78,&local_48);
      std::__cxx11::string::append((string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_98);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p == &local_b8.field_2) {
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             CONCAT71(local_b8.field_2._M_allocated_capacity._1_7_,local_b8.field_2._M_local_buf[0])
        ;
        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_b8.field_2._8_8_;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = local_b8._M_dataplus._M_p;
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             CONCAT71(local_b8.field_2._M_allocated_capacity._1_7_,local_b8.field_2._M_local_buf[0])
        ;
      }
      __return_storage_ptr__->_M_string_length = local_b8._M_string_length;
      local_b8._M_string_length = 0;
      local_b8.field_2._M_local_buf[0] = '\0';
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      goto LAB_0035003b;
    }
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)name);
LAB_0035003b:
  std::__cxx11::string::~string((string *)&local_b8);
  return __return_storage_ptr__;
}

Assistant:

std::string cmNinjaTargetGenerator::GetTargetFilePath(
  const std::string& name, const std::string& config) const
{
  std::string path = this->GetTargetOutputDir(config);
  if (path.empty() || path == ".") {
    return name;
  }
  path += cmStrCat('/', name);
  return path;
}